

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::HttpHeaders::Header> * __thiscall
kj::ArrayBuilder<kj::HttpHeaders::Header>::operator=
          (ArrayBuilder<kj::HttpHeaders::Header> *this,ArrayBuilder<kj::HttpHeaders::Header> *other)

{
  Header *pHVar1;
  RemoveConst<kj::HttpHeaders::Header> *pRVar2;
  Header *pHVar3;
  
  pHVar1 = this->ptr;
  if (pHVar1 != (Header *)0x0) {
    pRVar2 = this->pos;
    pHVar3 = this->endPtr;
    this->ptr = (Header *)0x0;
    this->pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    this->endPtr = (Header *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pHVar1,0x20,(long)pRVar2 - (long)pHVar1 >> 5,
               (long)pHVar3 - (long)pHVar1 >> 5,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Header *)0x0;
  other->pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  other->endPtr = (Header *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }